

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_create_list(lysc_node *schema,ly_path_predicate *predicates,lyxp_var *vars,
                      ly_bool store_only,lyd_node **node)

{
  int iVar1;
  ly_ctx *ctx;
  lysc_node *ctx_node;
  lysc_node *type;
  char *__s;
  LY_ERR LVar2;
  ulong uVar3;
  size_t value_len;
  lyd_node *node_00;
  lyd_value *val_00;
  lyd_value *plVar4;
  ulong uVar5;
  lyd_node *local_a0;
  lyd_value val;
  lyxp_var *var;
  lyd_node *key;
  
  local_a0 = (lyd_node *)0x0;
  val.field_2._16_8_ = 0;
  val.field_2.dec64 = 0;
  val.field_2._8_8_ = 0;
  val._canonical = (char *)0x0;
  val.realtype = (lysc_type *)0x0;
  if ((schema->nodetype != 0x10) || ((schema->flags & 0x200) != 0)) {
    __assert_fail("(schema->nodetype == LYS_LIST) && !(schema->flags & LYS_KEYLESS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x94,
                  "LY_ERR lyd_create_list(const struct lysc_node *, const struct ly_path_predicate *, const struct lyxp_var *, ly_bool, struct lyd_node **)"
                 );
  }
  LVar2 = lyd_create_inner(schema,&local_a0);
  if (LVar2 == LY_SUCCESS) {
    uVar5 = 0;
    ly_log_location(schema,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
    node_00 = local_a0;
    plVar4 = (lyd_value *)&(predicates->field_1).field_1.field_1;
    while( true ) {
      if (predicates == (ly_path_predicate *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)((long)&predicates[-1].field_1 + 0x28);
      }
      if (uVar3 <= uVar5) break;
      iVar1 = *(int *)((long)&plVar4[-1].field_2 + 8);
      val_00 = plVar4;
      if (iVar1 != 1) {
        if (iVar1 != 3) {
          __assert_fail("predicates[u].type == LY_PATH_PREDTYPE_LIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                        ,0xac,
                        "LY_ERR lyd_create_list(const struct lysc_node *, const struct ly_path_predicate *, const struct lyxp_var *, ly_bool, struct lyd_node **)"
                       );
        }
        LVar2 = lyxp_vars_find(schema->module->ctx,vars,plVar4->_canonical,0,&var);
        if (LVar2 != LY_SUCCESS) goto LAB_00128cfc;
        ly_log_location(*(lysc_node **)((long)&plVar4[-1].field_2 + 0x10),(lyd_node *)0x0,
                        (char *)0x0,(ly_in *)0x0);
        ctx = schema->module->ctx;
        ctx_node = *(lysc_node **)((long)&plVar4[-1].field_2 + 0x10);
        type = ctx_node[1].parent;
        __s = var->value;
        value_len = strlen(__s);
        LVar2 = lyd_value_store(ctx,&val,(lysc_type *)type,__s,value_len,'\0',store_only,
                                (ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,0x3f3,ctx_node,
                                (ly_bool *)0x0);
        ly_log_location_revert(1,0,0,0);
        val_00 = &val;
        if (LVar2 != LY_SUCCESS) goto LAB_00128cfc;
      }
      LVar2 = lyd_create_term2(*(lysc_node **)((long)&plVar4[-1].field_2 + 0x10),val_00,&key);
      if (val.realtype != (lysc_type *)0x0) {
        (*(val.realtype)->plugin->free)(schema->module->ctx,&val);
        val.field_2.dec64 = 0;
        val.field_2._8_8_ = 0;
        val._canonical = (char *)0x0;
        val.realtype = (lysc_type *)0x0;
        val.field_2._16_8_ = 0;
      }
      if (LVar2 != LY_SUCCESS) goto LAB_00128cfc;
      lyd_insert_node(node_00,(lyd_node **)0x0,key,0);
      uVar5 = uVar5 + 1;
      plVar4 = (lyd_value *)&plVar4[1].field_2;
    }
    lyd_hash(node_00);
    *node = node_00;
    node_00 = (lyd_node *)0x0;
    LVar2 = LY_SUCCESS;
  }
  else {
    LVar2 = LY_EMEM;
    node_00 = local_a0;
  }
LAB_00128cfc:
  ly_log_location_revert(1,0,0,0);
  lyd_free_tree(node_00);
  return LVar2;
}

Assistant:

LY_ERR
lyd_create_list(const struct lysc_node *schema, const struct ly_path_predicate *predicates, const struct lyxp_var *vars,
        ly_bool store_only, struct lyd_node **node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_node *list = NULL, *key;
    const struct lyd_value *value;
    struct lyd_value val = {0};
    struct lyxp_var *var;
    LY_ARRAY_COUNT_TYPE u;

    assert((schema->nodetype == LYS_LIST) && !(schema->flags & LYS_KEYLESS));

    /* create list */
    LY_CHECK_GOTO(ret = lyd_create_inner(schema, &list), cleanup);

    LOG_LOCSET(schema, NULL);

    /* create and insert all the keys */
    LY_ARRAY_FOR(predicates, u) {
        if (predicates[u].type == LY_PATH_PREDTYPE_LIST_VAR) {
            /* find the var */
            if ((ret = lyxp_vars_find(schema->module->ctx, vars, predicates[u].variable, 0, &var))) {
                goto cleanup;
            }

            /* store the value */
            LOG_LOCSET(predicates[u].key, NULL);
            ret = lyd_value_store(schema->module->ctx, &val, ((struct lysc_node_leaf *)predicates[u].key)->type,
                    var->value, strlen(var->value), 0, store_only, NULL, LY_VALUE_JSON, NULL, LYD_HINT_DATA, predicates[u].key, NULL);
            LOG_LOCBACK(1, 0);
            LY_CHECK_GOTO(ret, cleanup);

            value = &val;
        } else {
            assert(predicates[u].type == LY_PATH_PREDTYPE_LIST);
            value = &predicates[u].value;
        }

        ret = lyd_create_term2(predicates[u].key, value, &key);
        if (val.realtype) {
            val.realtype->plugin->free(schema->module->ctx, &val);
            memset(&val, 0, sizeof val);
        }
        LY_CHECK_GOTO(ret, cleanup);
        lyd_insert_node(list, NULL, key, LYD_INSERT_NODE_DEFAULT);
    }

    /* hash having all the keys */
    lyd_hash(list);

    /* success */
    *node = list;
    list = NULL;

cleanup:
    LOG_LOCBACK(1, 0);
    lyd_free_tree(list);
    return ret;
}